

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O2

void __thiscall libchars::validation::validation(validation *this)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->n2i)._M_t._M_impl.super__Rb_tree_header;
  (this->n2i)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->n2i)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->n2i)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->n2i)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->n2i)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->i2v)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->i2v)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->i2v)._M_t._M_impl.super__Rb_tree_header;
  (this->i2v)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->i2v)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->i2v)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->generator = 0x80;
  return;
}

Assistant:

validation() : generator(validator::AUTO) {}